

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# derive_key.cc
# Opt level: O1

int EVP_BytesToKey(EVP_CIPHER *type,EVP_MD *md,uchar *salt,uchar *data,int datal,int count,
                  uchar *key,uchar *iv)

{
  EVP_MD_CTX *ctx;
  size_t cnt;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  undefined4 in_register_00000084;
  uint8_t md_buf [64];
  ScopedEVP_MD_CTX c;
  uint local_f0;
  int local_ec;
  uchar *local_e8;
  int local_dc;
  size_t local_d8;
  ulong local_d0;
  uchar *local_c8;
  ulong local_c0;
  uchar *local_b8;
  EVP_MD *local_b0;
  EVP_CIPHER *local_a8;
  uchar *local_a0;
  uchar local_98 [104];
  
  local_f0 = 0;
  local_b8 = salt;
  local_b0 = md;
  uVar1 = EVP_CIPHER_key_length(type);
  uVar2 = EVP_CIPHER_iv_length(type);
  if (0x40 < uVar1) {
    __assert_fail("nkey <= EVP_MAX_KEY_LENGTH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/derive_key.cc"
                  ,0x24,
                  "int EVP_BytesToKey(const EVP_CIPHER *, const EVP_MD *, const uint8_t *, const uint8_t *, size_t, unsigned int, uint8_t *, uint8_t *)"
                 );
  }
  if (0x10 < uVar2) {
    __assert_fail("niv <= EVP_MAX_IV_LENGTH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/derive_key.cc"
                  ,0x25,
                  "int EVP_BytesToKey(const EVP_CIPHER *, const EVP_MD *, const uint8_t *, const uint8_t *, size_t, unsigned int, uint8_t *, uint8_t *)"
                 );
  }
  if (data != (uchar *)0x0) {
    local_e8 = key;
    ctx = (EVP_MD_CTX *)(local_98 + 0x48);
    local_c0 = (ulong)uVar1;
    local_a8 = type;
    local_a0 = data;
    EVP_MD_CTX_init(ctx);
    local_dc = count + -1;
    iVar4 = 0;
    local_d8 = CONCAT44(in_register_00000084,datal);
    local_d0 = (ulong)(uint)count;
    do {
      uVar6 = local_d0;
      cnt = local_d8;
      local_c8 = iv;
      iVar3 = EVP_DigestInit_ex(ctx,local_b0,(ENGINE *)0x0);
      if (((iVar3 == 0) ||
          ((((local_ec = iVar4, iVar4 != 0 &&
             (iVar4 = EVP_DigestUpdate(ctx,local_98,(ulong)local_f0), iVar4 == 0)) ||
            (iVar4 = EVP_DigestUpdate(ctx,local_a0,cnt), iVar4 == 0)) ||
           ((local_b8 != (uchar *)0x0 && (iVar4 = EVP_DigestUpdate(ctx,local_b8,8), iVar4 == 0))))))
         || (iVar4 = EVP_DigestFinal_ex(ctx,local_98,&local_f0), iVar4 == 0)) {
        uVar1 = 0;
        goto LAB_0020d346;
      }
      iVar4 = local_dc;
      if (1 < (uint)uVar6) {
        do {
          iVar3 = EVP_DigestInit_ex(ctx,local_b0,(ENGINE *)0x0);
          uVar1 = 0;
          if (iVar3 == 0) goto LAB_0020d346;
          iVar3 = EVP_DigestUpdate(ctx,local_98,(ulong)local_f0);
          uVar1 = 0;
          if ((iVar3 == 0) || (iVar3 = EVP_DigestFinal_ex(ctx,local_98,&local_f0), iVar3 == 0))
          goto LAB_0020d346;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      uVar6 = local_c0 & 0xffffffff;
      if (uVar6 == 0) {
        uVar5 = 0;
        local_c0 = 0;
      }
      else {
        uVar5 = 0;
        do {
          if (uVar5 == local_f0) {
            local_c0 = (ulong)(uint)((int)local_c0 - (int)uVar5);
            goto LAB_0020d2e8;
          }
          if (local_e8 == (uchar *)0x0) {
            local_e8 = (uchar *)0x0;
          }
          else {
            *local_e8 = local_98[uVar5];
            local_e8 = local_e8 + 1;
          }
          uVar5 = uVar5 + 1;
        } while ((int)local_c0 != (int)uVar5);
        local_c0 = 0;
        uVar5 = uVar6;
      }
LAB_0020d2e8:
      iv = local_c8;
      uVar1 = 0;
      if ((uVar2 != 0) && (uVar1 = uVar2, (uint)uVar5 != local_f0)) {
        do {
          uVar1 = uVar2;
          if ((uint)uVar5 == local_f0) break;
          if (iv == (uchar *)0x0) {
            iv = (uchar *)0x0;
          }
          else {
            *iv = local_98[uVar5 & 0xffffffff];
            iv = iv + 1;
          }
          uVar5 = (ulong)((uint)uVar5 + 1);
          uVar2 = uVar2 - 1;
          uVar1 = 0;
        } while (uVar2 != 0);
      }
      uVar2 = uVar1;
      iVar4 = local_ec + 1;
    } while ((int)local_c0 != 0 || uVar2 != 0);
    uVar1 = EVP_CIPHER_key_length(local_a8);
LAB_0020d346:
    OPENSSL_cleanse(local_98,0x40);
    EVP_MD_CTX_cleanup((EVP_MD_CTX *)(local_98 + 0x48));
  }
  return uVar1;
}

Assistant:

int EVP_BytesToKey(const EVP_CIPHER *type, const EVP_MD *md,
                   const uint8_t *salt, const uint8_t *data, size_t data_len,
                   unsigned count, uint8_t *key, uint8_t *iv) {
  uint8_t md_buf[EVP_MAX_MD_SIZE];
  unsigned addmd = 0;
  unsigned mds = 0, i;
  int rv = 0;

  unsigned nkey = EVP_CIPHER_key_length(type);
  unsigned niv = EVP_CIPHER_iv_length(type);

  assert(nkey <= EVP_MAX_KEY_LENGTH);
  assert(niv <= EVP_MAX_IV_LENGTH);

  if (data == nullptr) {
    return nkey;
  }

  bssl::ScopedEVP_MD_CTX c;
  for (;;) {
    if (!EVP_DigestInit_ex(c.get(), md, nullptr)) {
      goto err;
    }
    if (addmd++) {
      if (!EVP_DigestUpdate(c.get(), md_buf, mds)) {
        goto err;
      }
    }
    if (!EVP_DigestUpdate(c.get(), data, data_len)) {
      goto err;
    }
    if (salt != nullptr) {
      if (!EVP_DigestUpdate(c.get(), salt, PKCS5_SALT_LEN)) {
        goto err;
      }
    }
    if (!EVP_DigestFinal_ex(c.get(), md_buf, &mds)) {
      goto err;
    }

    for (i = 1; i < count; i++) {
      if (!EVP_DigestInit_ex(c.get(), md, nullptr) ||
          !EVP_DigestUpdate(c.get(), md_buf, mds) ||
          !EVP_DigestFinal_ex(c.get(), md_buf, &mds)) {
        goto err;
      }
    }

    i = 0;
    if (nkey) {
      for (;;) {
        if (nkey == 0 || i == mds) {
          break;
        }
        if (key != nullptr) {
          *(key++) = md_buf[i];
        }
        nkey--;
        i++;
      }
    }

    if (niv && i != mds) {
      for (;;) {
        if (niv == 0 || i == mds) {
          break;
        }
        if (iv != nullptr) {
          *(iv++) = md_buf[i];
        }
        niv--;
        i++;
      }
    }
    if (nkey == 0 && niv == 0) {
      break;
    }
  }
  rv = EVP_CIPHER_key_length(type);

err:
  OPENSSL_cleanse(md_buf, EVP_MAX_MD_SIZE);
  return rv;
}